

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_asn1.c
# Opt level: O0

int ossl_asn1_type_get_octetstring_int(ASN1_TYPE *a,long *num,uchar *data,int max_len)

{
  ASN1_ITEM *it;
  undefined4 in_ECX;
  undefined8 in_RDX;
  ASN1_OCTET_STRING *in_RSI;
  int *in_RDI;
  int ret;
  asn1_oct_int *atmp;
  ASN1_ITEM *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int max_len_00;
  ASN1_VALUE *val;
  undefined4 in_stack_ffffffffffffffe0;
  int32_t anum;
  
  anum = (int32_t)((ulong)in_RDX >> 0x20);
  val = (ASN1_VALUE *)0x0;
  max_len_00 = -1;
  if ((*in_RDI == 0x10) && (*(long *)(in_RDI + 2) != 0)) {
    asn1_oct_int_it();
    val = (ASN1_VALUE *)ASN1_TYPE_unpack_sequence(in_stack_ffffffffffffffc8,(ASN1_TYPE *)0x37ad42);
    if ((val != (ASN1_VALUE *)0x0) &&
       (max_len_00 = asn1_type_get_int_oct
                               (in_RSI,anum,(long *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                                (uchar *)val,max_len_00), max_len_00 != -1)) goto LAB_0037adb4;
  }
  ERR_new();
  ERR_set_debug((char *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),(int)((ulong)val >> 0x20),
                (char *)CONCAT44(max_len_00,in_stack_ffffffffffffffd0));
  ERR_set_error(0xd,0x6d,(char *)0x0);
LAB_0037adb4:
  it = (ASN1_ITEM *)asn1_oct_int_it();
  ASN1_item_free(val,it);
  return max_len_00;
}

Assistant:

int ossl_asn1_type_get_octetstring_int(const ASN1_TYPE *a, long *num,
                                       unsigned char *data, int max_len)
{
    asn1_oct_int *atmp = NULL;
    int ret = -1;

    if ((a->type != V_ASN1_SEQUENCE) || (a->value.sequence == NULL))
        goto err;

    atmp = ASN1_TYPE_unpack_sequence(ASN1_ITEM_rptr(asn1_oct_int), a);

    if (atmp == NULL)
        goto err;

    ret = asn1_type_get_int_oct(atmp->oct, atmp->num, num, data, max_len);

    if (ret == -1) {
 err:
        ERR_raise(ERR_LIB_ASN1, ASN1_R_DATA_IS_WRONG);
    }
    M_ASN1_free_of(atmp, asn1_oct_int);
    return ret;
}